

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O1

unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
__thiscall
duckdb::Binder::BindCreateTableInfo
          (Binder *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info)

{
  pointer info_00;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *in_RDX;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  
  info_00 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(in_RDX);
  BindCreateSchema((Binder *)info,info_00);
  local_20._M_head_impl =
       (in_RDX->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
       .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (in_RDX->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
  BindCreateTableInfo(this,info,(SchemaCatalogEntry *)&stack0xffffffffffffffe0);
  if (local_20._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)((long)((local_20._M_head_impl)->super_ParseInfo)._vptr_ParseInfo + 8))();
  }
  return (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            )this;
}

Assistant:

unique_ptr<BoundCreateTableInfo> Binder::BindCreateTableInfo(unique_ptr<CreateInfo> info) {
	auto &base = info->Cast<CreateTableInfo>();
	auto &schema = BindCreateSchema(base);
	return BindCreateTableInfo(std::move(info), schema);
}